

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::CloseGap
          (RepeatedPtrFieldBase *this,int start,int num)

{
  bool bVar1;
  Rep *pRVar2;
  int local_24;
  int i;
  Rep *r;
  int num_local;
  int start_local;
  RepeatedPtrFieldBase *this_local;
  
  bVar1 = using_sso(this);
  if (bVar1) {
    if ((start == 0) && (num == 1)) {
      this->tagged_rep_or_elem_ = (void *)0x0;
    }
  }
  else {
    pRVar2 = rep(this);
    for (local_24 = start + num; local_24 < pRVar2->allocated_size; local_24 = local_24 + 1) {
      pRVar2->elements[local_24 - num] = pRVar2->elements[local_24];
    }
    pRVar2->allocated_size = pRVar2->allocated_size - num;
  }
  ExchangeCurrentSize(this,this->current_size_ - num);
  return;
}

Assistant:

void RepeatedPtrFieldBase::CloseGap(int start, int num) {
  if (using_sso()) {
    if (start == 0 && num == 1) {
      tagged_rep_or_elem_ = nullptr;
    }
  } else {
    // Close up a gap of "num" elements starting at offset "start".
    Rep* r = rep();
    for (int i = start + num; i < r->allocated_size; ++i)
      r->elements[i - num] = r->elements[i];
    r->allocated_size -= num;
  }
  ExchangeCurrentSize(current_size_ - num);
}